

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mecab.cpp
# Opt level: O2

int Mecab_analysis(Mecab *m,char *str)

{
  char cVar1;
  long lVar2;
  char **ppcVar3;
  char *pcVar4;
  int iVar5;
  undefined8 *puVar6;
  int iVar7;
  long *plVar8;
  string f;
  
  iVar5 = 0;
  if (((m->model != (void *)0x0) && (puVar6 = (undefined8 *)m->tagger, puVar6 != (undefined8 *)0x0))
     && (plVar8 = (long *)m->lattice, iVar5 = 0, str != (char *)0x0 && plVar8 != (long *)0x0)) {
    if ((0 < m->size) || (m->feature != (char **)0x0)) {
      Mecab_refresh(m);
      puVar6 = (undefined8 *)m->tagger;
      plVar8 = (long *)m->lattice;
    }
    (**(code **)(*plVar8 + 0x48))(plVar8,str);
    cVar1 = (**(code **)*puVar6)(puVar6,plVar8);
    if (cVar1 == '\0') {
      (**(code **)*plVar8)(plVar8);
    }
    else {
      for (lVar2 = (*(code *)((undefined8 *)*plVar8)[2])(plVar8); lVar2 != 0;
          lVar2 = *(long *)(lVar2 + 8)) {
        if ((*(byte *)(lVar2 + 0x4f) & 0xfe) != 2) {
          m->size = m->size + 1;
        }
      }
      iVar5 = 1;
      if ((long)m->size != 0) {
        ppcVar3 = (char **)calloc((long)m->size,8);
        m->feature = ppcVar3;
        lVar2 = (**(code **)(*plVar8 + 0x10))(plVar8);
        iVar7 = 0;
        for (; lVar2 != 0; lVar2 = *(long *)(lVar2 + 8)) {
          if ((*(byte *)(lVar2 + 0x4f) & 0xfe) != 2) {
            f._M_dataplus._M_p = (pointer)&f.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&f,*(long *)(lVar2 + 0x30),
                       (ulong)*(ushort *)(lVar2 + 0x44) + *(long *)(lVar2 + 0x30));
            std::__cxx11::string::append((char *)&f);
            std::__cxx11::string::append((char *)&f);
            pcVar4 = strdup(f._M_dataplus._M_p);
            m->feature[iVar7] = pcVar4;
            iVar7 = iVar7 + 1;
            std::__cxx11::string::~string((string *)&f);
          }
        }
        (**(code **)*plVar8)(plVar8);
      }
    }
  }
  return iVar5;
}

Assistant:

BOOL Mecab_analysis(Mecab *m, const char *str)
{
   if(m->model == NULL || m->tagger == NULL || m->lattice == NULL || str == NULL)
      return FALSE;

   if(m->size > 0 || m->feature != NULL)
      Mecab_refresh(m);

   MeCab::Tagger *tagger = (MeCab::Tagger *) m->tagger;
   MeCab::Lattice *lattice = (MeCab::Lattice *) m->lattice;

   lattice->set_sentence(str);

   if(tagger->parse(lattice) == false) {
      lattice->clear();
      return FALSE;
   }

   for (const MeCab::Node* node = lattice->bos_node(); node; node = node->next) {
      if(node->stat != MECAB_BOS_NODE && node->stat != MECAB_EOS_NODE)
         m->size++;
   }

   if(m->size == 0)
      return TRUE;

   m->feature = (char **) calloc(m->size, sizeof(char *));
   int index = 0;
   for (const MeCab::Node* node = lattice->bos_node(); node; node = node->next) {
      if(node->stat != MECAB_BOS_NODE && node->stat != MECAB_EOS_NODE) {
         std::string f(node->surface, node->length);
         f += ",";
         f += node->feature;
         m->feature[index] = strdup(f.c_str());
         index++;
      }
   }

   lattice->clear();

   return TRUE;
}